

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Service_Request_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Service_Request_PDU *this)

{
  Supplies *pSVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  Supplies *this_00;
  KFLOAT32 KVar3;
  KStringStream ss;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_218,(Header7 *)this);
  poVar2 = std::operator<<(local_1a8,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,"-Service Request-\n");
  Logistics_Header::GetAsString_abi_cxx11_(&local_1d8,(Logistics_Header *)this);
  UTILS::IndentString(&local_238,&local_1d8,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  poVar2 = std::operator<<(poVar2,"\tService Type:           ");
  DATA_TYPE::ENUMS::GetEnumAsStringServiceTypeRequested_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui8ServiceTypeRequested,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,"\tNumber Of Supply Types: ");
  std::ostream::operator<<(poVar2,(ushort)(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  pSVar1 = (this->super_Resupply_Received_PDU).m_vSupplies.
           super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_Resupply_Received_PDU).m_vSupplies.
                 super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1
      ) {
    (*(this_00->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[2])(&local_238,this_00);
    UTILS::IndentString(&local_218,&local_238,Tabs_00,in_CL);
    poVar2 = std::operator<<(local_1a8,(string *)&local_218);
    poVar2 = std::operator<<(poVar2,"\tQuantity :\t");
    KVar3 = DATA_TYPE::Supplies::GetQuantity(this_00);
    std::ostream::operator<<(poVar2,(float)KVar3);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Service_Request_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Service Request-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tService Type:           " << GetEnumAsStringServiceTypeRequested( m_ui8ServiceTypeRequested )
       << "\tNumber Of Supply Types: " << ( KUINT16 )m_ui8NumSupplyTypes;

    // Now add supplies
    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 )
           << "\tQuantity :	" << citr->GetQuantity();
    }

    return ss.str();
}